

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_update_local_settings
              (nghttp2_session *session,nghttp2_settings_entry *iv,size_t niv)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint32_t uVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  nghttp2_settings_storage *pnVar8;
  nghttp2_session *local_40;
  uint32_t local_38;
  uint32_t local_34;
  
  if (niv == 0) {
    return 0;
  }
  uVar7 = 0;
  uVar1 = 0xffffffff;
  bVar3 = true;
  uVar4 = 0xffffffff;
  sVar6 = 0;
  do {
    while( true ) {
      sVar5 = sVar6 + 1;
      if (iv[sVar6].settings_id != 4) break;
      uVar4 = iv[sVar6].value;
LAB_006b9896:
      sVar6 = sVar5;
      if (sVar5 == niv) {
        if (bVar3) goto LAB_006b98f7;
        goto LAB_006b98c5;
      }
    }
    if (iv[sVar6].settings_id != 1) goto LAB_006b9896;
    uVar7 = iv[sVar6].value;
    if (uVar7 <= uVar1) {
      uVar1 = uVar7;
    }
    bVar3 = false;
    sVar6 = sVar5;
  } while (sVar5 != niv);
LAB_006b98c5:
  if (((uVar7 <= uVar1) ||
      (iVar2 = nghttp2_hd_inflate_change_table_size(&session->hd_inflater,(ulong)uVar1), iVar2 == 0)
      ) && (iVar2 = nghttp2_hd_inflate_change_table_size(&session->hd_inflater,(ulong)uVar7),
           iVar2 == 0)) {
LAB_006b98f7:
    if (uVar4 != 0xffffffff) {
      local_34 = (session->local_settings).initial_window_size;
      local_40 = session;
      local_38 = uVar4;
      iVar2 = nghttp2_map_each(&session->streams,update_local_initial_window_size_func,&local_40);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    sVar6 = 0;
    do {
      pnVar8 = &session->local_settings;
      switch(iv[sVar6].settings_id) {
      case 1:
        break;
      case 2:
        pnVar8 = (nghttp2_settings_storage *)&(session->local_settings).enable_push;
        break;
      case 3:
        pnVar8 = (nghttp2_settings_storage *)&(session->local_settings).max_concurrent_streams;
        break;
      case 4:
        pnVar8 = (nghttp2_settings_storage *)&(session->local_settings).initial_window_size;
        break;
      case 5:
        pnVar8 = (nghttp2_settings_storage *)&(session->local_settings).max_frame_size;
        break;
      case 6:
        pnVar8 = (nghttp2_settings_storage *)&(session->local_settings).max_header_list_size;
        break;
      default:
        goto switchD_006b9981_caseD_7;
      case 8:
        pnVar8 = (nghttp2_settings_storage *)&(session->local_settings).enable_connect_protocol;
        break;
      case 9:
        pnVar8 = (nghttp2_settings_storage *)&(session->local_settings).no_rfc7540_priorities;
      }
      pnVar8->header_table_size = iv[sVar6].value;
switchD_006b9981_caseD_7:
      sVar6 = sVar6 + 1;
    } while (niv != sVar6);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int nghttp2_session_update_local_settings(nghttp2_session *session,
                                          nghttp2_settings_entry *iv,
                                          size_t niv) {
  int rv;
  size_t i;
  int32_t new_initial_window_size = -1;
  uint32_t header_table_size = 0;
  uint32_t min_header_table_size = UINT32_MAX;
  uint8_t header_table_size_seen = 0;
  /* For NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE, use the value last
     seen.  For NGHTTP2_SETTINGS_HEADER_TABLE_SIZE, use both minimum
     value and last seen value. */
  for (i = 0; i < niv; ++i) {
    switch (iv[i].settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
      header_table_size_seen = 1;
      header_table_size = iv[i].value;
      min_header_table_size = nghttp2_min(min_header_table_size, iv[i].value);
      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
      new_initial_window_size = (int32_t)iv[i].value;
      break;
    }
  }
  if (header_table_size_seen) {
    if (min_header_table_size < header_table_size) {
      rv = nghttp2_hd_inflate_change_table_size(&session->hd_inflater,
                                                min_header_table_size);
      if (rv != 0) {
        return rv;
      }
    }

    rv = nghttp2_hd_inflate_change_table_size(&session->hd_inflater,
                                              header_table_size);
    if (rv != 0) {
      return rv;
    }
  }
  if (new_initial_window_size != -1) {
    rv = session_update_local_initial_window_size(
        session, new_initial_window_size,
        (int32_t)session->local_settings.initial_window_size);
    if (rv != 0) {
      return rv;
    }
  }

  for (i = 0; i < niv; ++i) {
    switch (iv[i].settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
      session->local_settings.header_table_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_ENABLE_PUSH:
      session->local_settings.enable_push = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:
      session->local_settings.max_concurrent_streams = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
      session->local_settings.initial_window_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:
      session->local_settings.max_frame_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:
      session->local_settings.max_header_list_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:
      session->local_settings.enable_connect_protocol = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:
      session->local_settings.no_rfc7540_priorities = iv[i].value;
      break;
    }
  }

  return 0;
}